

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

ON__UINT32 __thiscall ON_XMLVariant::DataCRC(ON_XMLVariant *this,ON__UINT32 crc)

{
  ON_XMLVariantPrivate *pOVar1;
  double dVar2;
  int iVar3;
  ON__UINT32 OVar4;
  anon_union_128_8_804602a9_for_ON_XMLVariantPrivate_3 *paVar5;
  int i;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t sStack_a0;
  ON__INT64 x [4];
  
  iVar3 = (*this->_vptr_ON_XMLVariant[3])();
  switch(iVar3) {
  case 1:
    x[0] = CONCAT71(x[0]._1_7_,(this->_private->field_2)._bool_val);
    sStack_a0 = 1;
    break;
  case 2:
    x[0] = CONCAT44(x[0]._4_4_,(this->_private->field_2)._int_val);
    sStack_a0 = 4;
    break;
  case 3:
    dVar2 = ((double)(this->_private->field_2)._float_val + 1e-06) * 100000.0;
    goto LAB_0067bed0;
  case 4:
    dVar2 = ((this->_private->field_2)._double_val + 1e-11) * 10000000000.0;
LAB_0067bed0:
    x[0] = (ON__INT64)dVar2;
LAB_0067bed5:
    sStack_a0 = 8;
    break;
  case 5:
    (*this->_vptr_ON_XMLVariant[0x2d])(x,this);
    OVar4 = ON_wString::DataCRCLower((ON_wString *)x,crc);
    ON_wString::~ON_wString((ON_wString *)x);
    return OVar4;
  case 6:
    x[0] = 0;
    x[1] = 0;
    pOVar1 = this->_private;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      x[lVar6] = (long)((*(double *)((long)&pOVar1->field_2 + lVar6 * 8) + 1e-11) * 10000000000.0);
    }
    sStack_a0 = 0x10;
    break;
  case 7:
    x[0] = 0;
    x[1] = 0;
    x[2] = 0;
    pOVar1 = this->_private;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      x[lVar6] = (long)((*(double *)((long)&pOVar1->field_2 + lVar6 * 8) + 1e-11) * 10000000000.0);
    }
    sStack_a0 = 0x18;
    break;
  case 8:
  case 9:
    x[2] = 0;
    x[3] = 0;
    x[0] = 0;
    x[1] = 0;
    pOVar1 = this->_private;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      x[lVar6] = (long)((*(double *)((long)&pOVar1->field_2 + lVar6 * 8) + 1e-11) * 10000000000.0);
    }
    sStack_a0 = 0x20;
    break;
  case 10:
    x[2] = 0;
    x[3] = 0;
    x[0] = 0;
    x[1] = 0;
    paVar5 = &this->_private->field_2;
    lVar7 = 0;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      lVar7 = (long)(int)lVar7;
      for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 4) {
        x[lVar7] = (long)((paVar5->_array_val[lVar8] + 1e-11) * 10000000000.0);
        lVar7 = lVar7 + 1;
      }
      paVar5 = (anon_union_128_8_804602a9_for_ON_XMLVariantPrivate_3 *)((long)paVar5 + 8);
    }
    sStack_a0 = 0x80;
    break;
  case 0xb:
    x[0] = (this->_private->field_2)._time_val;
    x[1] = (ON__INT64)(this->_private->field_2).m_xform.m_xform[0][1];
    sStack_a0 = 0x10;
    break;
  case 0xc:
    x[0] = (this->_private->field_2)._time_val;
    goto LAB_0067bed5;
  case 0xd:
    (*this->_vptr_ON_XMLVariant[0x2b])(x,this);
    crc = ON_Buffer::CRC32((ON_Buffer *)x,crc);
    ON_Buffer::~ON_Buffer((ON_Buffer *)x);
  default:
    goto switchD_0067bd60_default;
  }
  crc = ON_CRC32(crc,sStack_a0,x);
switchD_0067bd60_default:
  return crc;
}

Assistant:

ON__UINT32 ON_XMLVariant::DataCRC(ON__UINT32 crc) const
{
  switch (Type())
  {
  default:
    return crc;

  case Types::Double:
    return CRCReal(crc, _private->_double_val);

  case Types::Float:
    return CRCReal(crc, _private->_float_val);

  case Types::Integer:
  {
    const auto x = _private->_int_val;
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::DoubleArray2:
  {
    ON__INT64 x[2] = { 0 };
    for (int i = 0; i < 2; i++) x[i] = Integerize(_private->_array_val[i]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::DoubleArray3:
  {
    ON__INT64 x[3] = { 0 };
    for (int i = 0; i < 3; i++) x[i] = Integerize(_private->_array_val[i]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::DoubleArray4:
  case Types::DoubleColor4:
  {
    ON__INT64 x[4] = { 0 };
    for (int i = 0; i < 4; i++) x[i] = Integerize(_private->_array_val[i]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::Matrix:
  {
    int index = 0;
    ON__INT64 x[16] = { 0 };
    for (int j = 0; j < 4; j++)
      for (int i = 0; i < 4; i++)
        x[index++] = Integerize(_private->m_xform.m_xform[i][j]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::Bool:
  {
    const auto x = _private->_bool_val;
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::Uuid:
  {
    const auto u = _private->_uuid_val;
    return ON_CRC32(crc, sizeof(u), &u);
  }

  case Types::Time:
  {
    const auto t = _private->_time_val;
    return ON_CRC32(crc, sizeof(t), &t);
  }

  case Types::Buffer:
  {
    return AsBuffer().CRC32(crc);
  }

  case Types::String:
    return AsString().DataCRCLower(crc);
  }
}